

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

AggregateFunction *
duckdb::EmptyQuantileFunction<duckdb::MedianFunction>
          (LogicalType *input,LogicalType *result,LogicalType *extra_arg)

{
  initializer_list<duckdb::LogicalType> iVar1;
  LogicalTypeId LVar2;
  LogicalType *in_RCX;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  aggregate_simple_update_t unaff_retaddr;
  bind_aggregate_function_t in_stack_00000008;
  aggregate_destructor_t in_stack_00000010;
  aggregate_statistics_t in_stack_00000018;
  aggregate_window_t in_stack_00000020;
  aggregate_serialize_t in_stack_00000028;
  aggregate_deserialize_t in_stack_00000030;
  AggregateFunction *fun;
  allocator_type *in_stack_fffffffffffffed8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffee0;
  iterator in_stack_fffffffffffffee8;
  value_type *__x;
  size_type in_stack_fffffffffffffef0;
  code *this;
  LogicalType *local_b8;
  aggregate_update_t in_stack_ffffffffffffff88;
  aggregate_initialize_t in_stack_ffffffffffffff90;
  aggregate_size_t in_stack_ffffffffffffff98;
  LogicalType *in_stack_ffffffffffffffa0;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffa8;
  AggregateFunction *this_00;
  AggregateFunction *finalize;
  
  this_00 = (AggregateFunction *)&stack0xffffffffffffff98;
  finalize = in_RDI;
  duckdb::LogicalType::LogicalType((LogicalType *)this_00,in_RSI);
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x9cae80);
  iVar1._M_len = in_stack_fffffffffffffef0;
  iVar1._M_array = in_stack_fffffffffffffee8;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffee0,iVar1,in_stack_fffffffffffffed8);
  this = MedianFunction::Bind;
  __x = (value_type *)0x0;
  AggregateFunction::AggregateFunction
            (this_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(aggregate_combine_t)in_RSI,
             (aggregate_finalize_t)finalize,unaff_retaddr,in_stack_00000008,in_stack_00000010,
             in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x9caf30);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x9caf3d);
  local_b8 = (LogicalType *)&stack0xffffffffffffffb0;
  do {
    local_b8 = local_b8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_b8);
  } while (local_b8 != (LogicalType *)&stack0xffffffffffffff98);
  LVar2 = LogicalType::id(in_RCX);
  if (LVar2 != INVALID) {
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this,__x);
  }
  in_RDI->serialize = QuantileBindData::Serialize;
  in_RDI->deserialize = MedianFunction::Deserialize;
  in_RDI->order_dependent = NOT_ORDER_DEPENDENT;
  return in_RDI;
}

Assistant:

AggregateFunction EmptyQuantileFunction(LogicalType input, LogicalType result, const LogicalType &extra_arg) {
	AggregateFunction fun({std::move(input)}, std::move(result), nullptr, nullptr, nullptr, nullptr, nullptr, nullptr,
	                      OP::Bind);
	if (extra_arg.id() != LogicalTypeId::INVALID) {
		fun.arguments.push_back(extra_arg);
	}
	fun.serialize = QuantileBindData::Serialize;
	fun.deserialize = OP::Deserialize;
	fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
	return fun;
}